

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

DockWidgetArea QDockWidgetPrivate::toDockWidgetArea(DockPosition pos)

{
  DockWidgetArea DVar1;
  
  DVar1 = NoDockWidgetArea;
  if (pos < DockCount) {
    DVar1 = *(DockWidgetArea *)(&DAT_0065a0b0 + (ulong)pos * 4);
  }
  return DVar1;
}

Assistant:

Qt::DockWidgetArea QDockWidgetPrivate::toDockWidgetArea(QInternal::DockPosition pos)
{
    switch (pos) {
    case QInternal::LeftDock:   return Qt::LeftDockWidgetArea;
    case QInternal::RightDock:  return Qt::RightDockWidgetArea;
    case QInternal::TopDock:    return Qt::TopDockWidgetArea;
    case QInternal::BottomDock: return Qt::BottomDockWidgetArea;
    default: break;
    }
    return Qt::NoDockWidgetArea;
}